

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlBegin(int mode)

{
  int iVar1;
  uint uVar2;
  rlDrawCall *prVar3;
  _Bool _Var4;
  long lVar5;
  uint uVar6;
  
  prVar3 = (RLGL.currentBatch)->draws;
  lVar5 = (long)(RLGL.currentBatch)->drawCounter;
  iVar1 = prVar3[lVar5 + -1].mode;
  if (iVar1 != mode) {
    uVar2 = prVar3[lVar5 + -1].vertexCount;
    if (0 < (int)uVar2) {
      if (iVar1 == 4) {
        uVar6 = 1;
        if (3 < (int)uVar2) {
          uVar6 = 4 - (uVar2 & 3);
        }
      }
      else {
        uVar6 = 0;
        if ((iVar1 == 1) && (uVar6 = uVar2 & 3, (int)uVar2 < 4)) {
          uVar6 = uVar2;
        }
      }
      prVar3[lVar5 + -1].vertexAlignment = uVar6;
      _Var4 = rlCheckRenderBatchLimit
                        ((RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].
                         vertexAlignment);
      if (!_Var4) {
        RLGL.State.vertexCounter =
             RLGL.State.vertexCounter +
             (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].vertexAlignment
        ;
        (RLGL.currentBatch)->drawCounter = (RLGL.currentBatch)->drawCounter + 1;
      }
    }
    if (0xff < (RLGL.currentBatch)->drawCounter) {
      rlDrawRenderBatch(RLGL.currentBatch);
    }
    (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].mode = mode;
    (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].vertexCount = 0;
    (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].textureId =
         RLGL.State.defaultTextureId;
  }
  return;
}

Assistant:

void rlBegin(int mode)
{
    // Draw mode can be RL_LINES, RL_TRIANGLES and RL_QUADS
    // NOTE: In all three cases, vertex are accumulated over default internal vertex buffer
    if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode != mode)
    {
        if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount > 0)
        {
            // Make sure current RLGL.currentBatch->draws[i].vertexCount is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_LINES) RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount < 4)? RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount : RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%4);
            else if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_TRIANGLES) RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount < 4)? 1 : (4 - (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%4)));
            else RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = 0;

            if (!rlCheckRenderBatchLimit(RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment))
            {
                RLGL.State.vertexCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment;
                RLGL.currentBatch->drawCounter++;
            }
        }

        if (RLGL.currentBatch->drawCounter >= RL_DEFAULT_BATCH_DRAWCALLS) rlDrawRenderBatch(RLGL.currentBatch);

        RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode = mode;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount = 0;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].textureId = RLGL.State.defaultTextureId;
    }
}